

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,_QByteArray>_>::insert
          (QMovableArrayOps<std::pair<QByteArray,_QByteArray>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  pair<QByteArray,_QByteArray> **pppVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_90;
  pair<QByteArray,_QByteArray> local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.second.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_68.second.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.first.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.second.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.first.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.first.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QByteArray,_QByteArray>::pair(&local_68,t);
  bVar3 = (this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
          super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size != 0;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,(uint)(i == 0 && bVar3),n
             ,(pair<QByteArray,_QByteArray> **)0x0,
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      std::pair<QByteArray,_QByteArray>::pair
                ((this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
                 super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.ptr + -1,&local_68);
      pppVar1 = &(this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
                 super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.ptr;
      *pppVar1 = *pppVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
                super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_90,(QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,i,n);
    Inserter::insertFill(&local_90,&local_68,n);
    (local_90.data)->size = (local_90.data)->size + local_90.nInserts;
  }
  std::pair<QByteArray,_QByteArray>::~pair(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }